

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QFileSystemTreeView.cpp
# Opt level: O1

void __thiscall
QFileSystemTreeViewPrivate::~QFileSystemTreeViewPrivate(QFileSystemTreeViewPrivate *this)

{
  QObject::~QObject(&this->super_QObject);
  operator_delete(this,0x20);
  return;
}

Assistant:

class QFileSystemTreeViewPrivate : public QObject {
    Q_OBJECT

public:
    explicit QFileSystemTreeViewPrivate(QFileSystemTreeView *widgetP)
        : QObject(widgetP)
        , widget(widgetP)
        , model(new QFileSystemModel(this)) {
        connect(model, &QFileSystemModel::directoryLoaded, widget, &QFileSystemTreeView::directoryLoaded);
        connect(model, &QFileSystemModel::fileRenamed, widget, &QFileSystemTreeView::fileRenamed);
        connect(model, &QFileSystemModel::rootPathChanged, widget, &QFileSystemTreeView::rootPathChanged);
    }

    void updateItemSelection(const QStringList &selection, QItemSelectionModel::SelectionFlags flags,
                             int column = 0) const {
        // QMap give us sorting for free
        QMap<QModelIndex, QMap<QModelIndex, int>> mapIndexes;
        QItemSelection itemSelection;

        foreach (const QString &item, selection) {
            const QModelIndex index = model->index(item, column);

            if (index.isValid()) {
                mapIndexes[index.parent()][index]++;
            }
        }

        foreach (const QModelIndex &parent, mapIndexes.keys()) {
            const QModelIndexList indexes = mapIndexes[parent].keys();
            int top = -1;
            int bottom = -1;

            for (int i = 0; i < indexes.count(); i++) {
                const QModelIndex &index = indexes[i];
                const bool hasNext = i + 1 < indexes.count();

                if (top == -1) {
                    top = index.row();
                } else {
                    if (bottom == -1) {
                        // index is not contiguous
                        if (index.row() != top + 1) {
                            const QModelIndex idx = model->index(top, column, parent);
                            itemSelection << QItemSelectionRange(idx, idx);

                            top = index.row();
                            bottom = -1;
                        } else {
                            bottom = index.row();
                        }
                    } else if (index.row() != bottom + 1) {
                        // index is not contiguous
                        if (index.row() != top + 1) {
                            const QModelIndex idx1 = model->index(top, column, parent);
                            const QModelIndex idx2 = model->index(bottom, column, parent);
                            itemSelection << QItemSelectionRange(idx1, idx2);

                            top = index.row();
                            bottom = -1;
                        } else {
                            bottom = index.row();
                        }
                    }
                }

                if (!hasNext && top != -1) {
                    if (bottom == -1) {
                        bottom = top;
                    }

                    const QModelIndex idx1 = model->index(top, column, parent);
                    const QModelIndex idx2 = model->index(bottom, column, parent);
                    itemSelection << QItemSelection(idx1, idx2);

                    top = -1;
                    bottom = -1;
                }
            }
        }

        widget->selectionModel()->select(itemSelection, flags);
    }